

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGImpactShape.cpp
# Opt level: O1

void __thiscall
cbtGImpactMeshShapePart::calculateLocalInertia
          (cbtGImpactMeshShapePart *this,cbtScalar mass,cbtVector3 *inertia)

{
  PHY_ScalarType PVar1;
  int iVar2;
  uchar *puVar3;
  double dVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1c])();
  inertia->m_floats[0] = 0.0;
  inertia->m_floats[1] = 0.0;
  inertia->m_floats[2] = 0.0;
  inertia->m_floats[3] = 0.0;
  iVar5 = (this->m_primitive_manager).numverts;
  if (iVar5 != 0) {
    fVar8 = mass / (float)iVar5;
    cVar9 = inertia->m_floats[2];
    cVar10 = inertia->m_floats[0];
    cVar11 = inertia->m_floats[1];
    PVar1 = (this->m_primitive_manager).type;
    puVar3 = (this->m_primitive_manager).vertexbase;
    iVar2 = (this->m_primitive_manager).stride;
    uVar6 = (iVar5 + -1) * iVar2;
    uVar7 = uVar6;
    do {
      if (PVar1 == PHY_DOUBLE) {
        dVar4 = (double)(this->m_primitive_manager).m_scale.m_floats[0] *
                *(double *)(puVar3 + uVar6);
        auVar12._0_4_ = (float)dVar4;
        auVar12._4_4_ = (int)((ulong)dVar4 >> 0x20);
        auVar12._8_8_ = 0;
        dVar4 = (double)(this->m_primitive_manager).m_scale.m_floats[1] *
                *(double *)(puVar3 + (ulong)uVar6 + 8);
        auVar15._0_4_ = (float)dVar4;
        auVar15._4_4_ = (int)((ulong)dVar4 >> 0x20);
        auVar15._8_8_ = 0;
        auVar12 = vinsertps_avx(auVar12,auVar15,0x10);
        fVar14 = (float)((double)(this->m_primitive_manager).m_scale.m_floats[2] *
                        *(double *)(puVar3 + (ulong)uVar6 + 0x10));
      }
      else {
        auVar12 = vinsertps_avx(ZEXT416((uint)(*(float *)(puVar3 + uVar7) *
                                              (this->m_primitive_manager).m_scale.m_floats[0])),
                                ZEXT416((uint)(*(float *)(puVar3 + (ulong)uVar7 + 4) *
                                              (this->m_primitive_manager).m_scale.m_floats[1])),0x10
                               );
        fVar14 = *(float *)(puVar3 + (ulong)uVar7 + 8) *
                 (this->m_primitive_manager).m_scale.m_floats[2];
      }
      auVar13._0_4_ = auVar12._0_4_ * auVar12._0_4_;
      auVar13._4_4_ = auVar12._4_4_ * auVar12._4_4_;
      auVar13._8_4_ = auVar12._8_4_ * auVar12._8_4_;
      auVar13._12_4_ = auVar12._12_4_ * auVar12._12_4_;
      auVar12 = vmovshdup_avx(auVar13);
      cVar10 = cVar10 + fVar8 * (fVar14 * fVar14 + auVar12._0_4_);
      cVar11 = cVar11 + fVar8 * (fVar14 * fVar14 + auVar13._0_4_);
      cVar9 = fVar8 * (auVar13._0_4_ + auVar12._0_4_) + cVar9;
      inertia->m_floats[0] = cVar10;
      inertia->m_floats[1] = cVar11;
      inertia->m_floats[2] = cVar9;
      uVar7 = uVar7 - iVar2;
      uVar6 = uVar6 - iVar2;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  (*(this->super_cbtGImpactShapeInterface).super_cbtConcaveShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0x1d])(this);
  return;
}

Assistant:

void cbtGImpactMeshShapePart::calculateLocalInertia(cbtScalar mass, cbtVector3& inertia) const
{
	lockChildShapes();

#ifdef CALC_EXACT_INERTIA
	inertia.setValue(0.f, 0.f, 0.f);

	int i = this->getVertexCount();
	cbtScalar pointmass = mass / cbtScalar(i);

	while (i--)
	{
		cbtVector3 pointintertia;
		this->getVertex(i, pointintertia);
		pointintertia = gim_get_point_inertia(pointintertia, pointmass);
		inertia += pointintertia;
	}

#else

	// Calc box inertia

	cbtScalar lx = m_localAABB.m_max[0] - m_localAABB.m_min[0];
	cbtScalar ly = m_localAABB.m_max[1] - m_localAABB.m_min[1];
	cbtScalar lz = m_localAABB.m_max[2] - m_localAABB.m_min[2];
	const cbtScalar x2 = lx * lx;
	const cbtScalar y2 = ly * ly;
	const cbtScalar z2 = lz * lz;
	const cbtScalar scaledmass = mass * cbtScalar(0.08333333);

	inertia = scaledmass * (cbtVector3(y2 + z2, x2 + z2, x2 + y2));

#endif

	unlockChildShapes();
}